

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreMaterial.cpp
# Opt level: O1

bool __thiscall
Assimp::Ogre::OgreImporter::ReadTextureUnit
          (OgreImporter *this,string *textureUnitName,stringstream *ss,aiMaterial *material)

{
  uint index;
  pointer pcVar1;
  size_type sVar2;
  aiMaterial *this_00;
  char cVar3;
  int iVar4;
  Logger *pLVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  mapped_type *pmVar10;
  long *plVar11;
  long *plVar12;
  bool bVar13;
  _Alloc_hider _Var14;
  size_type sVar15;
  long lVar16;
  size_t sVar17;
  aiTextureType textureType;
  int uvCoord;
  string identifier;
  string partTexture;
  string linePart;
  string textureRef;
  string partTextCoordSet;
  string partColorOp;
  aiString assimpTextureRef;
  key_type local_598;
  int local_594;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  OgreImporter *local_570;
  char *local_568;
  size_t local_560;
  char local_558 [16];
  undefined1 *local_548;
  size_t local_540;
  undefined1 local_538 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  string *local_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_500;
  long local_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4e0;
  size_type local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  aiMaterial *local_4c0;
  undefined1 *local_4b8;
  size_t local_4b0;
  undefined1 local_4a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_498;
  undefined8 local_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  char *local_478;
  char local_468 [16];
  undefined1 *local_458 [2];
  undefined1 local_448 [16];
  undefined1 local_438 [24];
  long lStack_420;
  ios_base local_3c8 [920];
  
  local_548 = local_538;
  local_540 = 0;
  local_538[0] = 0;
  local_508 = textureUnitName;
  local_4c0 = material;
  std::operator>>((istream *)ss,(string *)&local_548);
  if ((local_540 == DAT_008f4318) &&
     ((local_540 == 0 || (iVar4 = bcmp(local_548,partBlockStart_abi_cxx11_,local_540), iVar4 == 0)))
     ) {
    pLVar5 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[18]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
               (char (*) [18])"   texture_unit \'");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_438,(local_508->_M_dataplus)._M_p,local_508->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"\'",1);
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar5,local_568);
    if (local_568 != local_558) {
      operator_delete(local_568);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
    std::ios_base::~ios_base(local_3c8);
    local_568 = local_558;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"texture","");
    local_4b8 = local_4a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"tex_coord_set","");
    local_458[0] = local_448;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"colour_op","");
    local_598 = aiTextureType_NONE;
    local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
    local_528._M_string_length = 0;
    local_528.field_2._M_local_buf[0] = '\0';
    local_594 = 0;
    local_570 = this;
LAB_0048e39e:
    do {
      while( true ) {
        if ((local_540 == DAT_008f4338) &&
           ((local_540 == 0 ||
            (iVar4 = bcmp(local_548,partBlockEnd_abi_cxx11_,local_540), iVar4 == 0))))
        goto LAB_0048ea37;
        std::operator>>((istream *)ss,(string *)&local_548);
        sVar17 = local_540;
        if ((local_540 != DAT_008f42f8) ||
           ((local_540 != 0 &&
            (iVar4 = bcmp(local_548,partComment_abi_cxx11_,local_540), iVar4 != 0)))) break;
        local_490 = 0;
        local_488._M_local_buf[0] = '\0';
        local_498 = &local_488;
        cVar3 = std::ios::widen((char)*(undefined8 *)(*(long *)ss + -0x18) + (char)ss);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)ss,(string *)&local_498,cVar3);
        _Var14._M_p = (pointer)local_498;
        if (local_498 != &local_488) {
LAB_0048ea13:
          operator_delete(_Var14._M_p);
        }
      }
      if ((sVar17 == local_560) &&
         ((sVar17 == 0 || (iVar4 = bcmp(local_548,local_568,sVar17), iVar4 == 0)))) {
        std::operator>>((istream *)ss,(string *)&local_548);
        std::__cxx11::string::_M_assign((string *)&local_528);
        if (this->m_detectTextureTypeFromFilename == true) {
          uVar6 = std::__cxx11::string::find_last_of((char *)&local_528,0x6d340e,0xffffffffffffffff)
          ;
          uVar7 = std::__cxx11::string::find_last_of((char *)&local_528,0x6cc22a,0xffffffffffffffff)
          ;
          if (uVar6 <= uVar7 || uVar6 == 0xffffffffffffffff) {
            local_598 = aiTextureType_DIFFUSE;
            this = local_570;
            goto LAB_0048e39e;
          }
          std::__cxx11::string::substr((ulong)&local_4e0,(ulong)&local_528);
          sVar2 = local_4d8;
          paVar9 = local_4e0;
          if (local_4d8 != 0) {
            sVar15 = 0;
            do {
              iVar4 = tolower((int)paVar9->_M_local_buf[sVar15]);
              paVar9->_M_local_buf[sVar15] = (char)iVar4;
              sVar15 = sVar15 + 1;
            } while (sVar2 != sVar15);
          }
          local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
          if (local_4e0 == &local_4d0) {
            local_590.field_2._8_8_ = local_4d0._8_8_;
          }
          else {
            local_590._M_dataplus._M_p = (pointer)local_4e0;
          }
          local_590.field_2._M_allocated_capacity._1_7_ = local_4d0._M_allocated_capacity._1_7_;
          local_590.field_2._M_local_buf[0] = local_4d0._M_local_buf[0];
          local_590._M_string_length = local_4d8;
          local_4d8 = 0;
          local_4d0._M_local_buf[0] = '\0';
          local_4e0 = &local_4d0;
          pLVar5 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[47]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_438,(char (*) [47])"Detecting texture type from filename postfix \'");
          this = local_570;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_438,local_590._M_dataplus._M_p,local_590._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"\'",1);
          std::__cxx11::stringbuf::str();
          Logger::debug(pLVar5,local_478);
          if (local_478 != local_468) {
            operator_delete(local_478);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
          std::ios_base::~ios_base(local_3c8);
          iVar4 = std::__cxx11::string::compare((char *)&local_590);
          if (((((iVar4 == 0) ||
                (iVar4 = std::__cxx11::string::compare((char *)&local_590), iVar4 == 0)) ||
               (iVar4 = std::__cxx11::string::compare((char *)&local_590), iVar4 == 0)) ||
              ((iVar4 = std::__cxx11::string::compare((char *)&local_590), iVar4 == 0 ||
               (iVar4 = std::__cxx11::string::compare((char *)&local_590), iVar4 == 0)))) ||
             (iVar4 = std::__cxx11::string::compare((char *)&local_590), iVar4 == 0)) {
            local_598 = aiTextureType_NORMALS;
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)&local_590);
            if (((iVar4 == 0) ||
                (iVar4 = std::__cxx11::string::compare((char *)&local_590), iVar4 == 0)) ||
               ((iVar4 = std::__cxx11::string::compare((char *)&local_590), iVar4 == 0 ||
                (iVar4 = std::__cxx11::string::compare((char *)&local_590), iVar4 == 0)))) {
              local_598 = aiTextureType_SPECULAR;
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)&local_590);
              if ((((iVar4 == 0) ||
                   (iVar4 = std::__cxx11::string::compare((char *)&local_590), iVar4 == 0)) ||
                  (iVar4 = std::__cxx11::string::compare((char *)&local_590), iVar4 == 0)) ||
                 ((iVar4 = std::__cxx11::string::compare((char *)&local_590), iVar4 == 0 ||
                  (iVar4 = std::__cxx11::string::compare((char *)&local_590), iVar4 == 0)))) {
                local_598 = aiTextureType_LIGHTMAP;
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)&local_590);
                if ((iVar4 == 0) ||
                   (iVar4 = std::__cxx11::string::compare((char *)&local_590), iVar4 == 0)) {
                  local_598 = aiTextureType_DISPLACEMENT;
                }
                else {
                  local_598 = aiTextureType_DIFFUSE;
                }
              }
            }
          }
          paVar9 = &local_590.field_2;
          _Var14._M_p = local_590._M_dataplus._M_p;
        }
        else {
          local_500 = &local_4f0;
          pcVar1 = (local_508->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_500,pcVar1,pcVar1 + local_508->_M_string_length);
          lVar8 = local_4f8;
          paVar9 = local_500;
          if (local_4f8 != 0) {
            lVar16 = 0;
            do {
              iVar4 = tolower((int)paVar9->_M_local_buf[lVar16]);
              paVar9->_M_local_buf[lVar16] = (char)iVar4;
              lVar16 = lVar16 + 1;
            } while (lVar8 != lVar16);
          }
          local_438._0_8_ = local_438 + 0x10;
          if (local_500 == &local_4f0) {
            lStack_420 = local_4f0._8_8_;
          }
          else {
            local_438._0_8_ = local_500;
          }
          local_438._17_7_ = local_4f0._M_allocated_capacity._1_7_;
          local_438[0x10] = local_4f0._M_local_buf[0];
          local_438._8_8_ = local_4f8;
          local_4f8 = 0;
          local_4f0._M_local_buf[0] = '\0';
          local_500 = &local_4f0;
          lVar8 = std::__cxx11::string::find(local_438,0x6de9b7,0);
          this = local_570;
          if (lVar8 == -1) {
            lVar8 = std::__cxx11::string::find(local_438,0x6deb6e,0);
            if (lVar8 == -1) {
              lVar8 = std::__cxx11::string::find(local_438,0x6deb7e,0);
              if (lVar8 == -1) {
                lVar8 = std::__cxx11::string::find(local_438,0x6debab,0);
                if (lVar8 == -1) {
                  local_598 = aiTextureType_DIFFUSE;
                }
                else {
                  local_598 = aiTextureType_DISPLACEMENT;
                }
              }
              else {
                local_598 = aiTextureType_LIGHTMAP;
              }
            }
            else {
              local_598 = aiTextureType_SPECULAR;
            }
          }
          else {
            local_598 = aiTextureType_NORMALS;
          }
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_438 + 0x10);
          _Var14._M_p = (pointer)local_438._0_8_;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var14._M_p != paVar9) goto LAB_0048ea13;
        goto LAB_0048e39e;
      }
      if ((sVar17 == local_4b0) &&
         ((sVar17 == 0 || (iVar4 = bcmp(local_548,local_4b8,sVar17), iVar4 == 0)))) {
        std::istream::operator>>(ss,&local_594);
      }
    } while( true );
  }
  pLVar5 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[63]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
             (char (*) [63])"Invalid material: Texture unit block start missing near index ");
  std::istream::tellg();
  std::ostream::_M_insert<long>((long)local_438);
  std::__cxx11::stringbuf::str();
  Logger::error(pLVar5,local_568);
  if (local_568 != local_558) {
    operator_delete(local_568);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  bVar13 = false;
  goto LAB_0048ed4f;
LAB_0048ea37:
  if (local_528._M_string_length == 0) {
    pLVar5 = DefaultLogger::get();
    Logger::warn(pLVar5,"Texture reference is empty, ignoring texture_unit.");
LAB_0048eceb:
    bVar13 = false;
  }
  else {
    if (local_598 == aiTextureType_NONE) {
      pLVar5 = DefaultLogger::get();
      std::operator+(&local_590,"Failed to detect texture type for \'",&local_528);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_590);
      plVar12 = plVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar12) {
        local_438._16_8_ = *plVar12;
        lStack_420 = plVar11[3];
        local_438._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_438 + 0x10);
      }
      else {
        local_438._16_8_ = *plVar12;
        local_438._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar11;
      }
      local_438._8_8_ = plVar11[1];
      *plVar11 = (long)plVar12;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      Logger::warn(pLVar5,(char *)local_438._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_438 + 0x10)) {
        operator_delete((void *)local_438._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_590._M_dataplus._M_p != &local_590.field_2) {
        operator_delete(local_590._M_dataplus._M_p);
      }
      goto LAB_0048eceb;
    }
    pmVar10 = std::
              map<aiTextureType,_unsigned_int,_std::less<aiTextureType>,_std::allocator<std::pair<const_aiTextureType,_unsigned_int>_>_>
              ::operator[](&this->m_textures,&local_598);
    index = *pmVar10;
    pmVar10 = std::
              map<aiTextureType,_unsigned_int,_std::less<aiTextureType>,_std::allocator<std::pair<const_aiTextureType,_unsigned_int>_>_>
              ::operator[](&this->m_textures,&local_598);
    *pmVar10 = *pmVar10 + 1;
    pLVar5 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[14]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
               (char (*) [14])"    texture \'");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_438,local_528._M_dataplus._M_p,local_528._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"\' type ",7);
    std::ostream::operator<<(local_438,local_598);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438," index ",7);
    std::ostream::_M_insert<unsigned_long>((ulong)local_438);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438," UV ",4);
    std::ostream::operator<<(local_438,local_594);
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar5,local_590._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_590._M_dataplus._M_p != &local_590.field_2) {
      operator_delete(local_590._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
    std::ios_base::~ios_base(local_3c8);
    sVar17 = 0x3ff;
    if ((local_528._M_string_length & 0xfffffc00) == 0) {
      sVar17 = local_528._M_string_length & 0xffffffff;
    }
    local_438._0_4_ = (int)sVar17;
    memcpy(local_438 + 4,local_528._M_dataplus._M_p,sVar17);
    this_00 = local_4c0;
    local_438[sVar17 + 4] = 0;
    aiMaterial::AddProperty(local_4c0,(aiString *)local_438,"$tex.file",local_598,index);
    aiMaterial::AddBinaryProperty(this_00,&local_594,4,"$tex.uvwsrc",local_598,index,aiPTI_Integer);
    bVar13 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0]);
  }
  if (local_4b8 != local_4a8) {
    operator_delete(local_4b8);
  }
  if (local_568 != local_558) {
    operator_delete(local_568);
  }
LAB_0048ed4f:
  if (local_548 != local_538) {
    operator_delete(local_548);
  }
  return bVar13;
}

Assistant:

bool OgreImporter::ReadTextureUnit(const std::string &textureUnitName, stringstream &ss, aiMaterial *material)
{
    string linePart;
    ss >> linePart;

    if (linePart != partBlockStart)
    {
        ASSIMP_LOG_ERROR_F( "Invalid material: Texture unit block start missing near index ", ss.tellg());
        return false;
    }

    ASSIMP_LOG_DEBUG_F("   texture_unit '", textureUnitName, "'");

    const string partTexture      = "texture";
    const string partTextCoordSet = "tex_coord_set";
    const string partColorOp      = "colour_op";

    aiTextureType textureType = aiTextureType_NONE;
    std::string textureRef;
    int uvCoord = 0;

    while(linePart != partBlockEnd)
    {
        ss >> linePart;

        // Skip commented lines
        if (linePart == partComment)
        {
            SkipLine(ss);
            continue;
        }

        if (linePart == partTexture)
        {
            ss >> linePart;
            textureRef = linePart;

            // User defined Assimp config property to detect texture type from filename.
            if (m_detectTextureTypeFromFilename)
            {
                size_t posSuffix = textureRef.find_last_of(".");
                size_t posUnderscore = textureRef.find_last_of("_");

                if (posSuffix != string::npos && posUnderscore != string::npos && posSuffix > posUnderscore)
                {
                    string identifier = Ogre::ToLower(textureRef.substr(posUnderscore, posSuffix - posUnderscore));
                    ASSIMP_LOG_DEBUG_F( "Detecting texture type from filename postfix '", identifier, "'");

                    if (identifier == "_n" || identifier == "_nrm" || identifier == "_nrml" || identifier == "_normal" || identifier == "_normals" || identifier == "_normalmap")
                    {
                        textureType = aiTextureType_NORMALS;
                    }
                    else if (identifier == "_s" || identifier == "_spec" || identifier == "_specular" || identifier == "_specularmap")
                    {
                        textureType = aiTextureType_SPECULAR;
                    }
                    else if (identifier == "_l" || identifier == "_light" || identifier == "_lightmap" || identifier == "_occ" || identifier == "_occlusion")
                    {
                        textureType = aiTextureType_LIGHTMAP;
                    }
                    else if (identifier == "_disp" || identifier == "_displacement")
                    {
                        textureType = aiTextureType_DISPLACEMENT;
                    }
                    else
                    {
                        textureType = aiTextureType_DIFFUSE;
                    }
                }
                else
                {
                    textureType = aiTextureType_DIFFUSE;
                }
            }
            // Detect from texture unit name. This cannot be too broad as
            // authors might give names like "LightSaber" or "NormalNinja".
            else
            {
                string unitNameLower = Ogre::ToLower(textureUnitName);
                if (unitNameLower.find("normalmap") != string::npos)
                {
                    textureType = aiTextureType_NORMALS;
                }
                else if (unitNameLower.find("specularmap") != string::npos)
                {
                    textureType = aiTextureType_SPECULAR;
                }
                else if (unitNameLower.find("lightmap") != string::npos)
                {
                    textureType = aiTextureType_LIGHTMAP;
                }
                else if (unitNameLower.find("displacementmap") != string::npos)
                {
                    textureType = aiTextureType_DISPLACEMENT;
                }
                else
                {
                    textureType = aiTextureType_DIFFUSE;
                }
            }
        }
        else if (linePart == partTextCoordSet)
        {
            ss >> uvCoord;
        }
        /// @todo Implement
        else if(linePart == partColorOp)
        {
            /*
            ss >> linePart;
            if("replace"==linePart)//I don't think, assimp has something for this...
            {
            }
            else if("modulate"==linePart)
            {
                //TODO: set value
                //material->AddProperty(aiTextureOp_Multiply)
            }
            */
        }
    }

    if (textureRef.empty())
    {
        ASSIMP_LOG_WARN("Texture reference is empty, ignoring texture_unit.");
        return false;
    }
    if (textureType == aiTextureType_NONE)
    {
        ASSIMP_LOG_WARN("Failed to detect texture type for '" + textureRef  + "', ignoring texture_unit.");
        return false;
    }

    unsigned int textureTypeIndex = m_textures[textureType];
    m_textures[textureType]++;

    ASSIMP_LOG_DEBUG_F( "    texture '", textureRef, "' type ", textureType,
        " index ", textureTypeIndex, " UV ", uvCoord);

    aiString assimpTextureRef(textureRef);
    material->AddProperty(&assimpTextureRef, AI_MATKEY_TEXTURE(textureType, textureTypeIndex));
    material->AddProperty(&uvCoord, 1, AI_MATKEY_UVWSRC(textureType, textureTypeIndex));

    return true;
}